

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O2

int MPIU_Alltoallv(void *sendbuf,int *sendcnts,int *sdispls,MPI_Datatype sendtype,void *recvbuf,
                  int *recvcnts,int *rdispls,MPI_Datatype recvtype,MPI_Comm comm,
                  MPIU_AlltoallvSparsePolicy policy)

{
  byte bVar1;
  void *__ptr;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  int *piVar10;
  int *piVar11;
  uint uVar12;
  int iVar13;
  int NTask;
  int NTask_1;
  int dense;
  int ThisTask_1;
  MPI_Datatype local_90;
  void *local_88;
  void *local_80;
  int *local_78;
  int *local_70;
  void *local_68;
  int *local_60;
  int *local_58;
  long local_50;
  ptrdiff_t send_elsize;
  int ThisTask;
  ptrdiff_t lb;
  
  local_90 = sendtype;
  local_88 = recvbuf;
  local_68 = sendbuf;
  MPI_Comm_rank(comm,&ThisTask);
  MPI_Comm_size(comm,&NTask);
  uVar2 = 0;
  uVar7 = 0;
  if (0 < NTask) {
    uVar7 = (ulong)(uint)NTask;
  }
  uVar12 = 0;
  for (; uVar7 != uVar2; uVar2 = uVar2 + 1) {
    uVar12 = uVar12 + (0 < sendcnts[uVar2]);
  }
  if (recvcnts == (int *)0x0) {
    recvcnts = (int *)malloc((long)NTask << 2);
    MPI_Alltoall(sendcnts);
    piVar11 = recvcnts;
  }
  else {
    piVar11 = (int *)0x0;
  }
  if (local_88 == (void *)0x0) {
    uVar7 = 0;
    uVar2 = (ulong)(uint)NTask;
    if (NTask < 1) {
      uVar2 = uVar7;
    }
    iVar5 = 0;
    for (; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      iVar5 = iVar5 + recvcnts[uVar7];
    }
    goto LAB_00105326;
  }
  local_60 = (int *)0x0;
  local_70 = sdispls;
  local_58 = piVar11;
  if (sdispls == (int *)0x0) {
    lVar9 = (long)NTask;
    local_60 = (int *)malloc(lVar9 * 4);
    iVar5 = 0;
    *local_60 = 0;
    for (lVar3 = 1; local_70 = local_60, lVar3 < lVar9; lVar3 = lVar3 + 1) {
      iVar5 = iVar5 + sendcnts[lVar3 + -1];
      local_60[lVar3] = iVar5;
    }
  }
  piVar10 = (int *)0x0;
  piVar11 = piVar10;
  if (rdispls == (int *)0x0) {
    rdispls = (int *)malloc((long)NTask * 4);
    *rdispls = 0;
    for (lVar3 = 1; piVar11 = rdispls, lVar3 < NTask; lVar3 = lVar3 + 1) {
      uVar8 = (int)piVar10 + recvcnts[lVar3 + -1];
      piVar10 = (int *)(ulong)uVar8;
      rdispls[lVar3] = uVar8;
    }
  }
  local_78 = rdispls;
  if (policy == AUTO) {
    dense = (int)(0x80 < uVar12);
    MPI_Allreduce(1,&dense,1,&ompi_mpi_int,&ompi_mpi_op_sum,comm);
    if (dense == 0) goto LAB_00105199;
LAB_00105157:
    iVar5 = MPI_Alltoallv(local_68,sendcnts,local_70,local_90,local_88,recvcnts,local_78,recvtype,
                          comm);
  }
  else {
    if (policy == REQUIRED) {
      dense = 0;
    }
    else if (policy == DISABLED) {
      dense = 1;
      goto LAB_00105157;
    }
LAB_00105199:
    MPI_Comm_rank(comm,&ThisTask_1);
    MPI_Comm_size(comm,&NTask_1);
    bVar4 = 0;
    do {
      bVar1 = bVar4 & 0x1f;
      uVar12 = 1 << bVar1;
      bVar4 = bVar4 + 1;
    } while ((int)uVar12 < NTask_1);
    MPI_Type_get_extent(local_90,&lb,&send_elsize);
    MPI_Type_get_extent(recvtype,&lb,&local_50);
    local_80 = malloc((long)NTask_1 << 4);
    iVar13 = 0;
    if (1 << bVar1 < 1) {
      uVar12 = 0;
    }
    for (uVar8 = 0; uVar12 != uVar8; uVar8 = uVar8 + 1) {
      uVar6 = ThisTask_1 ^ uVar8;
      if ((int)uVar6 < NTask_1) {
        if (recvcnts[(int)uVar6] != 0) {
          lVar3 = (long)iVar13;
          iVar13 = iVar13 + 1;
          MPI_Irecv((void *)(local_78[(int)uVar6] * local_50 + (long)local_88),recvcnts[(int)uVar6],
                    recvtype,uVar6,0x18e2e,comm,(void *)((long)local_80 + lVar3 * 8));
        }
      }
    }
    MPI_Barrier(comm);
    for (uVar8 = 0; __ptr = local_80, uVar12 != uVar8; uVar8 = uVar8 + 1) {
      uVar6 = ThisTask_1 ^ uVar8;
      if ((int)uVar6 < NTask_1) {
        if (sendcnts[(int)uVar6] != 0) {
          lVar3 = (long)iVar13;
          iVar13 = iVar13 + 1;
          MPI_Isend((void *)(local_70[(int)uVar6] * send_elsize + (long)local_68),
                    sendcnts[(int)uVar6],local_90,uVar6,0x18e2e,comm,
                    (void *)((long)local_80 + lVar3 * 8));
        }
      }
    }
    iVar5 = 0;
    MPI_Waitall(iVar13,local_80,0);
    free(__ptr);
    MPI_Barrier(comm);
  }
  free(piVar11);
  free(local_60);
  piVar11 = local_58;
LAB_00105326:
  free(piVar11);
  return iVar5;
}

Assistant:

int MPIU_Alltoallv(void *sendbuf, int *sendcnts, int *sdispls,
        MPI_Datatype sendtype, void *recvbuf, int *recvcnts,
        int *rdispls, MPI_Datatype recvtype, MPI_Comm comm,
        enum MPIU_AlltoallvSparsePolicy policy
)
/*
 * sdispls, recvcnts rdispls can be NULL,
 *
 * if recvbuf is NULL, returns total number of item required to hold the
 * data.
 * */
{
    int ThisTask;
    int NTask;
    MPI_Comm_rank(comm, &ThisTask);
    MPI_Comm_size(comm, &NTask);
    int i;
    int nn = 0;
    int *a_sdispls=NULL, *a_recvcnts=NULL, *a_rdispls=NULL;
    for(i = 0; i < NTask; i ++) {
        if(sendcnts[i] > 0) {
            nn ++;
        }
    }
    if(recvcnts == NULL) {
        a_recvcnts = malloc(sizeof(int) * NTask);
        recvcnts = a_recvcnts;
        MPI_Alltoall(sendcnts, 1, MPI_INT,
                     recvcnts, 1, MPI_INT, comm);
    }
    if(recvbuf == NULL) {
        int totalrecv = 0;
        for(i = 0; i < NTask; i ++) {
            totalrecv += recvcnts[i];
        }
        if(a_recvcnts)
            free(a_recvcnts);
        return totalrecv;
    }
    if(sdispls == NULL) {
        a_sdispls = malloc(sizeof(int) * NTask);
        sdispls = a_sdispls;
        sdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            sdispls[i] = sdispls[i - 1] + sendcnts[i - 1];
        }
    }
    if(rdispls == NULL) {
        a_rdispls = malloc(sizeof(int) * NTask);
        rdispls = a_rdispls;
        rdispls[0] = 0;
        for (i = 1; i < NTask; i++) {
            rdispls[i] = rdispls[i - 1] + recvcnts[i - 1];
        }
    }

    int dense;

    if(policy == AUTO) {
        dense = nn > 128;
        MPI_Allreduce(MPI_IN_PLACE, &dense, 1, MPI_INT, MPI_SUM, comm);
    }
    if(policy == DISABLED) {
        dense = 1;
    }
    if(policy == REQUIRED) {
        dense = 0;
    }

    int ret;
    if(dense != 0) {
        ret = MPI_Alltoallv(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    } else {
        ret = MPI_Alltoallv_sparse(sendbuf, sendcnts, sdispls,
                    sendtype, recvbuf,
                    recvcnts, rdispls, recvtype, comm);
    }

    if(a_rdispls)
        free(a_rdispls);
    if(a_sdispls)
        free(a_sdispls);
    if(a_recvcnts)
        free(a_recvcnts);
    return ret;
}